

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_3dmView * __thiscall ON_ClassArray<ON_3dmView>::AppendNew(ON_ClassArray<ON_3dmView> *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0x5f0) < 0x10000001)) {
      uVar3 = 4;
      if (2 < (int)uVar1) {
        uVar3 = uVar1 * 2;
      }
    }
    else {
      uVar3 = 0x2b1e2;
      if (uVar1 < 0x2b1e2) {
        uVar3 = uVar1;
      }
      uVar3 = uVar3 + uVar1;
    }
    if (uVar1 < uVar3) {
      SetCapacity(this,(long)(int)uVar3);
    }
  }
  else {
    ON_3dmView::~ON_3dmView(this->m_a + (int)uVar1);
    ON_3dmView::ON_3dmView(this->m_a + this->m_count);
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}